

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::EdgeChainSimplifier::Run(EdgeChainSimplifier *this)

{
  int iVar1;
  bool bVar2;
  VertexId VVar3;
  EdgeId EVar4;
  Edge *pEVar5;
  size_type sVar6;
  reference pvVar7;
  reference this_00;
  reference __x;
  reference this_01;
  int local_8c;
  int layer;
  int e_2;
  Edge edge_1;
  int local_6c;
  undefined1 auStack_68 [4];
  EdgeId e_1;
  reference local_58;
  Edge local_48;
  Edge edge;
  int local_2c;
  undefined1 auStack_28 [4];
  EdgeId e;
  int local_14;
  EdgeChainSimplifier *pEStack_10;
  VertexId v;
  EdgeChainSimplifier *this_local;
  
  pEStack_10 = this;
  for (local_14 = 0; iVar1 = local_14, VVar3 = Graph::num_vertices(this->g_), iVar1 < VVar3;
      local_14 = local_14 + 1) {
    bVar2 = IsInterior(this,local_14);
    _auStack_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (&this->is_interior_,(long)local_14);
    std::_Bit_reference::operator=((_Bit_reference *)auStack_28,bVar2);
  }
  for (local_2c = 0; EVar4 = Graph::num_edges(this->g_), local_2c < EVar4; local_2c = local_2c + 1)
  {
    _edge = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used_,(long)local_2c);
    bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&edge);
    if (!bVar2) {
      pEVar5 = Graph::edge(this->g_,local_2c);
      local_48 = *pEVar5;
      local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->is_interior_,(long)local_48.first);
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_58);
      if (!bVar2) {
        _auStack_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (&this->is_interior_,(long)local_48.second);
        bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_68);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          SimplifyChain(this,local_48.first,local_48.second);
        }
        else {
          OutputEdge(this,local_2c);
        }
      }
    }
  }
  for (local_6c = 0; EVar4 = Graph::num_edges(this->g_), local_6c < EVar4; local_6c = local_6c + 1)
  {
    _edge_1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used_,(long)local_6c);
    bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&edge_1);
    if (!bVar2) {
      pEVar5 = Graph::edge(this->g_,local_6c);
      layer = (*pEVar5).first;
      e_2 = (*pEVar5).second;
      if (layer == e_2) {
        OutputEdge(this,local_6c);
      }
      else {
        SimplifyChain(this,layer,e_2);
      }
    }
  }
  for (local_8c = 0;
      sVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        (&this->new_edges_), (ulong)(long)local_8c < sVar6; local_8c = local_8c + 1)
  {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->new_edge_layers_,(long)local_8c);
    iVar1 = *pvVar7;
    this_00 = std::
              vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
              ::operator[](this->layer_edges_,(long)iVar1);
    __x = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                    (&this->new_edges_,(long)local_8c);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back(this_00,__x);
    this_01 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](this->layer_input_edge_ids_,(long)iVar1);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->new_input_edge_ids_,(long)local_8c);
    std::vector<int,_std::allocator<int>_>::push_back(this_01,pvVar7);
  }
  return;
}

Assistant:

void S2Builder::EdgeChainSimplifier::Run() {
  // Determine which vertices can be interior vertices of an edge chain.
  for (VertexId v = 0; v < g_.num_vertices(); ++v) {
    is_interior_[v] = IsInterior(v);
  }
  // Attempt to simplify all edge chains that start from a non-interior
  // vertex.  (This takes care of all chains except loops.)
  for (EdgeId e = 0; e < g_.num_edges(); ++e) {
    if (used_[e]) continue;
    Edge edge = g_.edge(e);
    if (is_interior_[edge.first]) continue;
    if (!is_interior_[edge.second]) {
      OutputEdge(e);  // An edge between two non-interior vertices.
    } else {
      SimplifyChain(edge.first, edge.second);
    }
  }
  // If there are any edges left, they form one or more disjoint loops where
  // all vertices are interior vertices.
  //
  // TODO(ericv): It would be better to start from the edge with the smallest
  // min_input_edge_id(), since that would make the output more predictable
  // for testing purposes.  It also means that we won't create an edge that
  // spans the start and end of a polyline if the polyline is snapped into a
  // loop.  (Unfortunately there are pathological examples that prevent us
  // from guaranteeing this in general, e.g. there could be two polylines in
  // different layers that snap to the same loop but start at different
  // positions.  In general we only consider input edge ids to be a hint
  // towards the preferred output ordering.)
  for (EdgeId e = 0; e < g_.num_edges(); ++e) {
    if (used_[e]) continue;
    Edge edge = g_.edge(e);
    if (edge.first == edge.second) {
      // Note that it is safe to output degenerate edges as we go along,
      // because this vertex has at least one non-degenerate outgoing edge and
      // therefore we will (or just did) start an edge chain here.
      OutputEdge(e);
    } else {
      SimplifyChain(edge.first, edge.second);
    }
  }

  // Finally, copy the output edges into the appropriate layers.  They don't
  // need to be sorted because the input edges were also unsorted.
  for (int e = 0; e < new_edges_.size(); ++e) {
    int layer = new_edge_layers_[e];
    (*layer_edges_)[layer].push_back(new_edges_[e]);
    (*layer_input_edge_ids_)[layer].push_back(new_input_edge_ids_[e]);
  }
}